

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeSetP4KeyInfo(Parse *pParse,Index *pIdx)

{
  int iVar1;
  Vdbe *pVVar2;
  Op *pOVar3;
  KeyInfo *p4;
  
  pVVar2 = pParse->pVdbe;
  p4 = sqlite3KeyInfoOfIndex(pParse,pIdx);
  if (p4 != (KeyInfo *)0x0) {
    if (pVVar2->db->mallocFailed != '\0') {
      freeP4(pVVar2->db,-9,p4);
      return;
    }
    pOVar3 = pVVar2->aOp;
    iVar1 = pVVar2->nOp;
    pOVar3[(long)iVar1 + -1].p4type = -9;
    pOVar3[(long)iVar1 + -1].p4.pKeyInfo = p4;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetP4KeyInfo(Parse *pParse, Index *pIdx){
  Vdbe *v = pParse->pVdbe;
  KeyInfo *pKeyInfo;
  assert( v!=0 );
  assert( pIdx!=0 );
  pKeyInfo = sqlite3KeyInfoOfIndex(pParse, pIdx);
  if( pKeyInfo ) sqlite3VdbeAppendP4(v, pKeyInfo, P4_KEYINFO);
}